

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

void WriteVarLen(TArray<unsigned_char,_unsigned_char> *file,DWORD value)

{
  uchar local_19;
  uint local_18;
  uint local_14;
  DWORD buffer;
  DWORD value_local;
  TArray<unsigned_char,_unsigned_char> *file_local;
  
  local_18 = value & 0x7f;
  local_14 = value;
  while (local_14 = local_14 >> 7, local_14 != 0) {
    local_18 = local_14 & 0x7f | 0x80 | local_18 << 8;
  }
  local_14 = 0;
  _buffer = file;
  while( true ) {
    local_19 = (uchar)local_18;
    TArray<unsigned_char,_unsigned_char>::Push(_buffer,&local_19);
    if ((local_18 & 0x80) == 0) break;
    local_18 = local_18 >> 8;
  }
  return;
}

Assistant:

static void WriteVarLen (TArray<BYTE> &file, DWORD value)
{
   DWORD buffer = value & 0x7F;

   while ( (value >>= 7) )
   {
     buffer <<= 8;
     buffer |= (value & 0x7F) | 0x80;
   }

   for (;;)
   {
	   file.Push(BYTE(buffer));
	   if (buffer & 0x80)
	   {
		   buffer >>= 8;
	   }
	   else
	   {
		   break;
	   }
   }
}